

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O1

int read_attribute(coda_cdf_product *product_file,int64_t offset,int32_t data_type,int32_t num_elems
                  ,coda_dynamic_type **attribute)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  coda_type_array *type;
  coda_type_array *type_00;
  coda_mem_array *type_01;
  coda_type_class type_class;
  coda_type_array *type_02;
  ulong uVar4;
  coda_native_type read_type;
  
  uVar4 = 1;
  read_type = coda_native_type_int8;
  type_class = coda_integer_class;
  bVar1 = false;
  if (0x1e < data_type) {
    switch(data_type) {
    case 0x29:
      goto switchD_00149668_caseD_1;
    case 0x2a:
    case 0x2b:
    case 0x2e:
    case 0x2f:
    case 0x30:
    case 0x31:
    case 0x32:
      goto switchD_00149668_caseD_3;
    case 0x2c:
      goto switchD_00149668_caseD_15;
    case 0x33:
    case 0x34:
      read_type = coda_native_type_string;
      type_class = coda_text_class;
      bVar1 = true;
      uVar4 = (ulong)(uint)num_elems;
      goto switchD_00149668_caseD_1;
    default:
      if (data_type != 0x1f) {
        if (data_type != 0x21) goto switchD_00149668_caseD_3;
        goto switchD_00149668_caseD_8;
      }
    case 0x2d:
switchD_00149668_caseD_16:
      uVar4 = 8;
      read_type = coda_native_type_double;
LAB_001496d8:
      type_class = coda_real_class;
    }
    goto LAB_001496dd;
  }
  read_type = coda_native_type_int8;
  bVar1 = false;
  switch(data_type) {
  case 1:
    goto switchD_00149668_caseD_1;
  case 2:
    read_type = coda_native_type_int16;
    goto LAB_001497ec;
  default:
switchD_00149668_caseD_3:
    coda_set_error(-100,"invalid CDF data type (%d)",(ulong)(uint)data_type);
    return -1;
  case 4:
    read_type = coda_native_type_int32;
    bVar1 = false;
    uVar4 = 4;
    goto switchD_00149668_caseD_1;
  case 8:
switchD_00149668_caseD_8:
    uVar4 = 8;
    read_type = coda_native_type_int64;
    break;
  case 0xb:
    read_type = coda_native_type_uint8;
    break;
  case 0xc:
    read_type = coda_native_type_uint16;
LAB_001497ec:
    bVar1 = false;
    uVar4 = 2;
    goto switchD_00149668_caseD_1;
  case 0xe:
    uVar4 = 4;
    read_type = coda_native_type_uint32;
    break;
  case 0x15:
switchD_00149668_caseD_15:
    uVar4 = 4;
    read_type = coda_native_type_float;
    goto LAB_001496d8;
  case 0x16:
    goto switchD_00149668_caseD_16;
  }
LAB_001496dd:
  bVar1 = false;
switchD_00149668_caseD_1:
  if ((type_class & ~coda_array_class) == coda_integer_class) {
    type = (coda_type_array *)coda_type_number_new(coda_format_cdf,type_class);
  }
  else {
    type = (coda_type_array *)coda_type_text_new(coda_format_cdf);
  }
  if (type != (coda_type_array *)0x0) {
    iVar2 = coda_type_set_read_type((coda_type *)type,read_type);
    type_02 = type;
    if ((iVar2 == 0) &&
       ((iVar2 = (int)uVar4, bVar1 ||
        ((iVar3 = coda_type_set_byte_size((coda_type *)type,uVar4), iVar3 == 0 &&
         (iVar3 = coda_type_number_set_endianness((coda_type_number *)type,coda_little_endian),
         iVar3 == 0)))))) {
      if (0xfffffffd < data_type - 0x35U || num_elems == 1) {
        iVar2 = read_attribute_sub(product_file,offset,iVar2,(coda_type *)type,attribute);
        coda_type_release((coda_type *)type);
        return -(uint)(iVar2 != 0);
      }
      type_00 = coda_type_array_new(coda_format_cdf);
      if (type_00 != (coda_type_array *)0x0) {
        iVar3 = coda_type_array_set_base_type(type_00,(coda_type *)type);
        if (iVar3 == 0) {
          coda_type_release((coda_type *)type);
          iVar3 = coda_type_array_add_variable_dimension(type_00,(coda_expression *)0x0);
          type_02 = type_00;
          if (iVar3 == 0) {
            type_01 = coda_mem_array_new(type_00,(coda_dynamic_type *)0x0);
            coda_type_release((coda_type *)type_00);
            if (type_01 == (coda_mem_array *)0x0) {
              return -1;
            }
            if (0 < num_elems) {
              uVar4 = (ulong)(uint)num_elems;
              do {
                iVar3 = read_attribute_sub(product_file,offset,iVar2,(coda_type *)type,attribute);
                if (iVar3 != 0) {
LAB_001498fc:
                  coda_dynamic_type_delete((coda_dynamic_type *)type_01);
                  return -1;
                }
                iVar3 = coda_mem_array_add_element(type_01,*attribute);
                if (iVar3 != 0) {
                  coda_dynamic_type_delete((coda_dynamic_type *)type_01);
                  type_01 = (coda_mem_array *)*attribute;
                  goto LAB_001498fc;
                }
                offset = offset + iVar2;
                uVar4 = uVar4 - 1;
              } while (uVar4 != 0);
            }
            return 0;
          }
        }
        else {
          coda_type_release((coda_type *)type_00);
        }
      }
    }
    coda_type_release((coda_type *)type_02);
  }
  return -1;
}

Assistant:

static int read_attribute(coda_cdf_product *product_file, int64_t offset, int32_t data_type,
                          int32_t num_elems, coda_dynamic_type **attribute)
{
    coda_type_class type_class;
    coda_native_type native_type;
    coda_type *definition;
    int32_t byte_size;

    switch (data_type)
    {
        case 1:        /* INT1 */
        case 41:       /* BYTE */
            type_class = coda_integer_class;
            native_type = coda_native_type_int8;
            byte_size = 1;
            break;
        case 2:        /* INT2 */
            type_class = coda_integer_class;
            native_type = coda_native_type_int16;
            byte_size = 2;
            break;
        case 4:        /* INT4 */
            type_class = coda_integer_class;
            native_type = coda_native_type_int32;
            byte_size = 4;
            break;
        case 8:        /* INT8 */
        case 33:       /* CDF_TIME_TT2000 */
            type_class = coda_integer_class;
            native_type = coda_native_type_int64;
            byte_size = 8;
            break;
        case 11:       /* UINT1 */
            type_class = coda_integer_class;
            native_type = coda_native_type_uint8;
            byte_size = 1;
            break;
        case 12:       /* UINT2 */
            type_class = coda_integer_class;
            native_type = coda_native_type_uint16;
            byte_size = 2;
            break;
        case 14:       /* UINT4 */
            type_class = coda_integer_class;
            native_type = coda_native_type_uint32;
            byte_size = 4;
            break;
        case 21:       /* REAL4 */
        case 44:       /* FLOAT */
            type_class = coda_real_class;
            native_type = coda_native_type_float;
            byte_size = 4;
            break;
        case 22:       /* REAL8 */
        case 31:       /* CDF_EPOCH */
        case 45:       /* DOUBLE */
            type_class = coda_real_class;
            native_type = coda_native_type_double;
            byte_size = 8;
            break;
        case 51:       /* CHAR */
        case 52:       /* UCHAR */
            type_class = coda_text_class;
            native_type = coda_native_type_string;
            byte_size = num_elems;
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid CDF data type (%d)", data_type);
            return -1;
    }
    switch (type_class)
    {
        case coda_integer_class:
        case coda_real_class:
            definition = (coda_type *)coda_type_number_new(coda_format_cdf, type_class);
            break;
        case coda_text_class:
            definition = (coda_type *)coda_type_text_new(coda_format_cdf);
            break;
        default:
            assert(0);
            exit(1);
    }
    if (definition == NULL)
    {
        return -1;
    }
    if (coda_type_set_read_type(definition, native_type) != 0)
    {
        coda_type_release(definition);
        return -1;
    }
    if (type_class != coda_text_class)
    {
        if (coda_type_set_byte_size(definition, byte_size) != 0)
        {
            coda_type_release(definition);
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        if (coda_type_number_set_endianness((coda_type_number *)definition, coda_little_endian) != 0)
        {
            coda_type_release(definition);
            return -1;
        }
#endif
    }

    if (num_elems != 1 && data_type != 51 && data_type != 52)
    {
        coda_type_array *array_definition;
        coda_mem_array *array = NULL;
        int i;

        /* create an array */
        array_definition = coda_type_array_new(coda_format_cdf);
        if (array_definition == NULL)
        {
            coda_type_release(definition);
            return -1;
        }
        if (coda_type_array_set_base_type(array_definition, definition) != 0)
        {
            coda_type_release((coda_type *)array_definition);
            coda_type_release(definition);
            return -1;
        }
        coda_type_release(definition);
        if (coda_type_array_add_variable_dimension(array_definition, NULL) != 0)
        {
            coda_type_release((coda_type *)array_definition);
            return -1;
        }
        array = coda_mem_array_new(array_definition, NULL);
        if (array == NULL)
        {
            coda_type_release((coda_type *)array_definition);
            return -1;
        }
        coda_type_release((coda_type *)array_definition);
        for (i = 0; i < num_elems; i++)
        {
            if (read_attribute_sub(product_file, offset + i * byte_size, byte_size, definition, attribute) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)array);
                return -1;
            }
            if (coda_mem_array_add_element(array, *attribute) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)array);
                coda_dynamic_type_delete(*attribute);
                return -1;
            }
        }
    }
    else
    {
        if (read_attribute_sub(product_file, offset, byte_size, definition, attribute) != 0)
        {
            coda_type_release(definition);
            return -1;
        }
        coda_type_release(definition);
    }

    return 0;
}